

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O2

void Vec_VecFree(Vec_Vec_t *p)

{
  Vec_Ptr_t *p_00;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < p->nSize; i_00 = i_00 + 1) {
    p_00 = Vec_VecEntry(p,i_00);
    if (p_00 != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree(p_00);
    }
  }
  Vec_PtrFree((Vec_Ptr_t *)p);
  return;
}

Assistant:

static inline void Vec_VecFree( Vec_Vec_t * p )
{
    Vec_Ptr_t * vVec;
    int i;
    Vec_VecForEachLevel( p, vVec, i )
        if ( vVec ) Vec_PtrFree( vVec );
    Vec_PtrFree( (Vec_Ptr_t *)p );
}